

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

void __thiscall llvm::DWARFVerifier::verifyDebugLineRows(DWARFVerifier *this)

{
  DWARFContext *this_00;
  undefined2 uVar1;
  bool bVar2;
  uint16_t uVar3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar4;
  pointer pDVar5;
  LineTable *this_01;
  size_type sVar6;
  vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
  *this_02;
  ulong FileIndex_00;
  char *Str;
  unsigned_short *puVar7;
  StringMapEntry<unsigned_short> *pSVar8;
  raw_ostream *prVar9;
  unsigned_long *puVar10;
  const_reference this_03;
  Optional<unsigned_long> OVar11;
  char *local_490;
  char *local_478;
  Optional<llvm::DWARFFormValue> local_2d0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_298;
  undefined1 local_290;
  format_object<unsigned_long> local_288;
  byte local_269;
  undefined1 local_268 [7];
  bool isDWARF5;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_230;
  undefined1 local_228;
  format_object<unsigned_long> local_220;
  reference local_208;
  Row *Row;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RowVector *__range2_1;
  uint64_t uStack_1e0;
  uint32_t RowIndex;
  uint64_t PrevAddress;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1a0;
  undefined1 local_198;
  format_object<unsigned_long> local_190;
  StringRef local_178;
  StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
  local_168;
  StringRef local_160;
  StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
  local_150;
  iterator It;
  undefined1 local_130 [7];
  bool HasFullPath;
  string FullPath;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_d8;
  undefined1 local_d0;
  format_object<unsigned_long> local_c8;
  reference local_a0;
  FileNameEntry *FileName;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
  *__range2;
  StringMap<unsigned_short,_llvm::MallocAllocator> FullPathMap;
  uint32_t FileIndex;
  uint32_t MaxDirIndex;
  LineTable *LineTable;
  DWARFDie Die;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *CU;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
  *local_18;
  unit_iterator_range *__range1;
  DWARFVerifier *this_local;
  
  __range1 = (unit_iterator_range *)this;
  ___begin1 = DWARFContext::compile_units(this->DCtx);
  local_18 = (iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
              *)&__begin1;
  __end1 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
           ::begin(local_18);
  puVar4 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
           ::end(local_18);
  do {
    if (__end1 == puVar4) {
      return;
    }
    Die.Die = (DWARFDebugInfoEntry *)__end1;
    pDVar5 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                       (__end1);
    _LineTable = DWARFUnit::getUnitDIE(pDVar5,true);
    this_00 = this->DCtx;
    pDVar5 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::get
                       ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                        Die.Die);
    this_01 = DWARFContext::getLineTableForUnit(this_00,pDVar5);
    if (this_01 != (LineTable *)0x0) {
      sVar6 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::size
                        (&(this_01->Prologue).IncludeDirectories);
      FullPathMap._28_4_ = SUB84(sVar6,0);
      FullPathMap._24_4_ = 1;
      StringMap<unsigned_short,_llvm::MallocAllocator>::StringMap
                ((StringMap<unsigned_short,_llvm::MallocAllocator> *)&__range2);
      this_02 = &(this_01->Prologue).FileNames;
      __end2 = std::
               vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
               ::begin(this_02);
      FileName = (FileNameEntry *)
                 std::
                 vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                 ::end(this_02);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_llvm::DWARFDebugLine::FileNameEntry_*,_std::vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>_>
                                         *)&FileName), bVar2) {
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_llvm::DWARFDebugLine::FileNameEntry_*,_std::vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>_>
                   ::operator*(&__end2);
        if ((ulong)(uint)FullPathMap._28_4_ < local_a0->DirIdx) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          prVar9 = error(this);
          prVar9 = raw_ostream::operator<<(prVar9,".debug_line[");
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)((long)&FullPath.field_2 + 8),
                         (DWARFDie *)&LineTable,DW_AT_stmt_list);
          OVar11 = dwarf::toSectionOffset
                             ((Optional<llvm::DWARFFormValue> *)((long)&FullPath.field_2 + 8));
          local_d8 = OVar11.Storage.field_0;
          local_d0 = OVar11.Storage.hasVal;
          puVar10 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_d8);
          format<unsigned_long>(&local_c8,"0x%08lx",puVar10);
          prVar9 = raw_ostream::operator<<(prVar9,&local_c8.super_format_object_base);
          prVar9 = raw_ostream::operator<<(prVar9,"].prologue.file_names[");
          prVar9 = raw_ostream::operator<<(prVar9,FullPathMap._24_4_);
          prVar9 = raw_ostream::operator<<(prVar9,"].dir_idx contains an invalid index: ");
          prVar9 = raw_ostream::operator<<(prVar9,local_a0->DirIdx);
          raw_ostream::operator<<(prVar9,"\n");
        }
        std::__cxx11::string::string((string *)local_130);
        FileIndex_00 = (ulong)(uint)FullPathMap._24_4_;
        pDVar5 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                           ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            Die.Die);
        Str = DWARFUnit::getCompilationDir(pDVar5);
        StringRef::StringRef((StringRef *)&It,Str);
        bVar2 = DWARFDebugLine::LineTable::getFileNameByIndex
                          (this_01,FileIndex_00,_It,AbsoluteFilePath,(string *)local_130);
        if (!bVar2) {
          __assert_fail("HasFullPath && \"Invalid index?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                        ,0x2da,"void llvm::DWARFVerifier::verifyDebugLineRows()");
        }
        StringRef::StringRef(&local_160,(string *)local_130);
        local_150.Ptr =
             (StringMapEntryBase **)
             StringMap<unsigned_short,_llvm::MallocAllocator>::find
                       ((StringMap<unsigned_short,_llvm::MallocAllocator> *)&__range2,local_160);
        local_168.Ptr =
             (StringMapEntryBase **)
             StringMap<unsigned_short,_llvm::MallocAllocator>::end
                       ((StringMap<unsigned_short,_llvm::MallocAllocator> *)&__range2);
        bVar2 = StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                ::operator==(&local_150,(StringMapIterator<unsigned_short> *)&local_168);
        if (bVar2) {
          uVar1 = FullPathMap._24_2_;
          StringRef::StringRef(&local_178,(string *)local_130);
          puVar7 = StringMap<unsigned_short,_llvm::MallocAllocator>::operator[]
                             ((StringMap<unsigned_short,_llvm::MallocAllocator> *)&__range2,
                              local_178);
          *puVar7 = uVar1;
        }
        else {
          pSVar8 = iterator_facade_base<llvm::StringMapIterator<unsigned_short>,_std::forward_iterator_tag,_llvm::StringMapEntry<unsigned_short>,_long,_llvm::StringMapEntry<unsigned_short>_*,_llvm::StringMapEntry<unsigned_short>_&>
                   ::operator->((iterator_facade_base<llvm::StringMapIterator<unsigned_short>,_std::forward_iterator_tag,_llvm::StringMapEntry<unsigned_short>,_long,_llvm::StringMapEntry<unsigned_short>_*,_llvm::StringMapEntry<unsigned_short>_&>
                                 *)&local_150);
          if ((uint)(pSVar8->super_StringMapEntryStorage<unsigned_short>).second !=
              FullPathMap._24_4_) {
            prVar9 = warn(this);
            prVar9 = raw_ostream::operator<<(prVar9,".debug_line[");
            DWARFDie::find((Optional<llvm::DWARFFormValue> *)&PrevAddress,(DWARFDie *)&LineTable,
                           DW_AT_stmt_list);
            OVar11 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)&PrevAddress);
            local_1a0 = OVar11.Storage.field_0;
            local_198 = OVar11.Storage.hasVal;
            puVar10 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_1a0);
            format<unsigned_long>(&local_190,"0x%08lx",puVar10);
            prVar9 = raw_ostream::operator<<(prVar9,&local_190.super_format_object_base);
            prVar9 = raw_ostream::operator<<(prVar9,"].prologue.file_names[");
            prVar9 = raw_ostream::operator<<(prVar9,FullPathMap._24_4_);
            prVar9 = raw_ostream::operator<<(prVar9,"] is a duplicate of file_names[");
            pSVar8 = iterator_facade_base<llvm::StringMapIterator<unsigned_short>,_std::forward_iterator_tag,_llvm::StringMapEntry<unsigned_short>,_long,_llvm::StringMapEntry<unsigned_short>_*,_llvm::StringMapEntry<unsigned_short>_&>
                     ::operator->((iterator_facade_base<llvm::StringMapIterator<unsigned_short>,_std::forward_iterator_tag,_llvm::StringMapEntry<unsigned_short>,_long,_llvm::StringMapEntry<unsigned_short>_*,_llvm::StringMapEntry<unsigned_short>_&>
                                   *)&local_150);
            prVar9 = raw_ostream::operator<<
                               (prVar9,(uint)(pSVar8->super_StringMapEntryStorage<unsigned_short>).
                                             second);
            raw_ostream::operator<<(prVar9,"]\n");
          }
        }
        FullPathMap._24_4_ = FullPathMap._24_4_ + 1;
        std::__cxx11::string::~string((string *)local_130);
        __gnu_cxx::
        __normal_iterator<const_llvm::DWARFDebugLine::FileNameEntry_*,_std::vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>_>
        ::operator++(&__end2);
      }
      uStack_1e0 = 0;
      __range2_1._4_4_ = 0;
      __end2_1 = std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                 ::begin(&this_01->Rows);
      Row = (Row *)std::
                   vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::
                   end(&this_01->Rows);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_llvm::DWARFDebugLine::Row_*,_std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>_>
                                 *)&Row), bVar2) {
        local_208 = __gnu_cxx::
                    __normal_iterator<const_llvm::DWARFDebugLine::Row_*,_std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>_>
                    ::operator*(&__end2_1);
        if ((local_208->Address).Address < uStack_1e0) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          prVar9 = error(this);
          prVar9 = raw_ostream::operator<<(prVar9,".debug_line[");
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_268,(DWARFDie *)&LineTable,
                         DW_AT_stmt_list);
          OVar11 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_268);
          local_230 = OVar11.Storage.field_0;
          local_228 = OVar11.Storage.hasVal;
          puVar10 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_230);
          format<unsigned_long>(&local_220,"0x%08lx",puVar10);
          prVar9 = raw_ostream::operator<<(prVar9,&local_220.super_format_object_base);
          prVar9 = raw_ostream::operator<<(prVar9,"] row[");
          prVar9 = raw_ostream::operator<<(prVar9,__range2_1._4_4_);
          raw_ostream::operator<<(prVar9,"] decreases in address from previous row:\n");
          DWARFDebugLine::Row::dumpTableHeader(this->OS);
          if (__range2_1._4_4_ != 0) {
            this_03 = std::
                      vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                      ::operator[](&this_01->Rows,(ulong)(__range2_1._4_4_ - 1));
            DWARFDebugLine::Row::dump(this_03,this->OS);
          }
          DWARFDebugLine::Row::dump(local_208,this->OS);
          raw_ostream::operator<<(this->OS,'\n');
        }
        bVar2 = DWARFDebugLine::LineTable::hasFileAtIndex(this_01,(ulong)local_208->File);
        if (!bVar2) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          uVar3 = DWARFDebugLine::Prologue::getVersion(&this_01->Prologue);
          local_269 = 4 < uVar3;
          prVar9 = error(this);
          prVar9 = raw_ostream::operator<<(prVar9,".debug_line[");
          DWARFDie::find(&local_2d0,(DWARFDie *)&LineTable,DW_AT_stmt_list);
          OVar11 = dwarf::toSectionOffset(&local_2d0);
          local_298 = OVar11.Storage.field_0;
          local_290 = OVar11.Storage.hasVal;
          puVar10 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_298);
          format<unsigned_long>(&local_288,"0x%08lx",puVar10);
          prVar9 = raw_ostream::operator<<(prVar9,&local_288.super_format_object_base);
          prVar9 = raw_ostream::operator<<(prVar9,"][");
          prVar9 = raw_ostream::operator<<(prVar9,__range2_1._4_4_);
          prVar9 = raw_ostream::operator<<(prVar9,"] has invalid file index ");
          prVar9 = raw_ostream::operator<<(prVar9,(uint)local_208->File);
          prVar9 = raw_ostream::operator<<(prVar9," (valid values are [");
          if ((local_269 & 1) == 0) {
            local_478 = "1,";
          }
          else {
            local_478 = "0,";
          }
          prVar9 = raw_ostream::operator<<(prVar9,local_478);
          sVar6 = std::
                  vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                  ::size(&(this_01->Prologue).FileNames);
          prVar9 = raw_ostream::operator<<(prVar9,sVar6);
          if ((local_269 & 1) == 0) {
            local_490 = "]";
          }
          else {
            local_490 = ")";
          }
          prVar9 = raw_ostream::operator<<(prVar9,local_490);
          raw_ostream::operator<<(prVar9,"):\n");
          DWARFDebugLine::Row::dumpTableHeader(this->OS);
          DWARFDebugLine::Row::dump(local_208,this->OS);
          raw_ostream::operator<<(this->OS,'\n');
        }
        if (((byte)local_208->field_0x1d >> 2 & 1) == 0) {
          uStack_1e0 = (local_208->Address).Address;
        }
        else {
          uStack_1e0 = 0;
        }
        __range2_1._4_4_ = __range2_1._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<const_llvm::DWARFDebugLine::Row_*,_std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>_>
        ::operator++(&__end2_1);
      }
      StringMap<unsigned_short,_llvm::MallocAllocator>::~StringMap
                ((StringMap<unsigned_short,_llvm::MallocAllocator> *)&__range2);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void DWARFVerifier::verifyDebugLineRows() {
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    // If there is no line table we will have created an error in the
    // .debug_info verifier or in verifyDebugLineStmtOffsets().
    if (!LineTable)
      continue;

    // Verify prologue.
    uint32_t MaxDirIndex = LineTable->Prologue.IncludeDirectories.size();
    uint32_t FileIndex = 1;
    StringMap<uint16_t> FullPathMap;
    for (const auto &FileName : LineTable->Prologue.FileNames) {
      // Verify directory index.
      if (FileName.DirIdx > MaxDirIndex) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "].prologue.file_names[" << FileIndex
                << "].dir_idx contains an invalid index: " << FileName.DirIdx
                << "\n";
      }

      // Check file paths for duplicates.
      std::string FullPath;
      const bool HasFullPath = LineTable->getFileNameByIndex(
          FileIndex, CU->getCompilationDir(),
          DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, FullPath);
      assert(HasFullPath && "Invalid index?");
      (void)HasFullPath;
      auto It = FullPathMap.find(FullPath);
      if (It == FullPathMap.end())
        FullPathMap[FullPath] = FileIndex;
      else if (It->second != FileIndex) {
        warn() << ".debug_line["
               << format("0x%08" PRIx64,
                         *toSectionOffset(Die.find(DW_AT_stmt_list)))
               << "].prologue.file_names[" << FileIndex
               << "] is a duplicate of file_names[" << It->second << "]\n";
      }

      FileIndex++;
    }

    // Verify rows.
    uint64_t PrevAddress = 0;
    uint32_t RowIndex = 0;
    for (const auto &Row : LineTable->Rows) {
      // Verify row address.
      if (Row.Address.Address < PrevAddress) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "] row[" << RowIndex
                << "] decreases in address from previous row:\n";

        DWARFDebugLine::Row::dumpTableHeader(OS);
        if (RowIndex > 0)
          LineTable->Rows[RowIndex - 1].dump(OS);
        Row.dump(OS);
        OS << '\n';
      }

      // Verify file index.
      if (!LineTable->hasFileAtIndex(Row.File)) {
        ++NumDebugLineErrors;
        bool isDWARF5 = LineTable->Prologue.getVersion() >= 5;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "][" << RowIndex << "] has invalid file index " << Row.File
                << " (valid values are [" << (isDWARF5 ? "0," : "1,")
                << LineTable->Prologue.FileNames.size()
                << (isDWARF5 ? ")" : "]") << "):\n";
        DWARFDebugLine::Row::dumpTableHeader(OS);
        Row.dump(OS);
        OS << '\n';
      }
      if (Row.EndSequence)
        PrevAddress = 0;
      else
        PrevAddress = Row.Address.Address;
      ++RowIndex;
    }
  }
}